

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O3

ON_4dPoint * __thiscall ON_4dPoint::operator=(ON_4dPoint *this,float *p)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  
  if (p == (float *)0x0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
    dVar5 = 0.0;
    dVar6 = 1.0;
  }
  else {
    dVar2 = (double)(float)*(undefined8 *)p;
    dVar3 = (double)(float)((ulong)*(undefined8 *)p >> 0x20);
    dVar5 = (double)(float)*(undefined8 *)(p + 2);
    dVar6 = (double)(float)((ulong)*(undefined8 *)(p + 2) >> 0x20);
  }
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
  this->x = dVar2;
  this->y = (double)auVar1._8_8_;
  auVar4._8_4_ = SUB84(dVar6,0);
  auVar4._0_8_ = dVar5;
  auVar4._12_4_ = (int)((ulong)dVar6 >> 0x20);
  this->z = dVar5;
  this->w = (double)auVar4._8_8_;
  return this;
}

Assistant:

ON_4dPoint& ON_4dPoint::operator=(const float* p)
{
  if ( p ) {
    x = (double)p[0];
    y = (double)p[1];
    z = (double)p[2];
    w = (double)p[3];
  }
  else {
    x = y = z = 0.0; w = 1.0;
  }
  return *this;
}